

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O2

bool __thiscall UEFIToolApplication::event(UEFIToolApplication *this,QEvent *event)

{
  UEFITool *this_00;
  undefined1 uVar1;
  QArrayDataPointer<char16_t> local_28;
  
  if (*(short *)(event + 8) == 0x74) {
    this_00 = this->tool;
    local_28.d = *(Data **)(event + 0x10);
    local_28.ptr = *(char16_t **)(event + 0x18);
    local_28.size = *(qsizetype *)(event + 0x20);
    if (local_28.d != (Data *)0x0) {
      LOCK();
      ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    UEFITool::openImageFile(this_00,(QString *)&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
  uVar1 = QApplication::event((QEvent *)this);
  return (bool)uVar1;
}

Assistant:

virtual bool event(QEvent *event)
    {
        if (event->type() == QEvent::FileOpen) {
            QFileOpenEvent *openEvent = static_cast<QFileOpenEvent *>(event);
            tool->openImageFile(openEvent->file());
        }
        
        return QApplication::event(event);
    }